

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite_correlated_expressions.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::RewriteCountAggregates::VisitReplace
          (RewriteCountAggregates *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true> type;
  _Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true> value;
  long *in_RDX;
  LogicalTypeId *in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> in_RDI;
  type result_if_false;
  templated_unique_single_t result_if_true;
  type check;
  templated_unique_single_t is_null;
  iterator entry;
  unordered_map<duckdb::ColumnBinding,_unsigned_long,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>_>
  *in_stack_ffffffffffffff08;
  Value *in_stack_ffffffffffffff10;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  ExpressionType *in_stack_ffffffffffffff48;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_b0 [3];
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffff68;
  unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
  *in_stack_ffffffffffffff70;
  Value *in_stack_ffffffffffffff78;
  undefined1 local_58 [31];
  undefined1 local_39;
  
  type._M_cur = (__node_type *)
                ::std::
                unordered_map<duckdb::ColumnBinding,_unsigned_long,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>_>
                ::find(in_stack_ffffffffffffff08,(key_type *)0x1a03ed6);
  value._M_cur = (__node_type *)
                 ::std::
                 unordered_map<duckdb::ColumnBinding,_unsigned_long,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>_>
                 ::end(in_stack_ffffffffffffff08);
  bVar1 = ::std::__detail::operator!=
                    ((_Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>
                      *)&stack0xffffffffffffffd8,
                     (_Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>
                      *)&stack0xffffffffffffffd0);
  if (bVar1) {
    local_39 = 0xe;
    make_uniq<duckdb::BoundOperatorExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&>
              (in_stack_ffffffffffffff48,in_RSI);
    unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
    ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                  *)in_stack_ffffffffffffff10);
    (**(code **)(*in_RDX + 0x88))(local_58);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x1a03f9c);
    unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
    ::unique_ptr((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                  *)in_stack_ffffffffffffff10,
                 (unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                  *)in_stack_ffffffffffffff08);
    Value::Numeric((LogicalType *)type._M_cur,(int64_t)value._M_cur);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>(in_stack_ffffffffffffff78);
    Value::~Value(in_stack_ffffffffffffff10);
    this_00 = local_b0;
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
              (this_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_ffffffffffffff08);
    make_uniq<duckdb::BoundCaseExpression,duckdb::unique_ptr<duckdb::BoundOperatorExpression,std::default_delete<duckdb::BoundOperatorExpression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<duckdb::BoundCaseExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
              (this_00,(unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>_>
                        *)in_stack_ffffffffffffff08);
    unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                   *)0x1a0403c);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0x1a04046);
    unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                   *)0x1a04053);
    unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                   *)0x1a04060);
    unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                   *)0x1a0406d);
  }
  else {
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<std::default_delete<duckdb::Expression>,void>
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Expression> RewriteCountAggregates::VisitReplace(BoundColumnRefExpression &expr,
                                                            unique_ptr<Expression> *expr_ptr) {
	auto entry = replacement_map.find(expr.binding);
	if (entry != replacement_map.end()) {
		// reference to a COUNT(*) aggregate
		// replace this with CASE WHEN COUNT(*) IS NULL THEN 0 ELSE COUNT(*) END
		auto is_null = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_IS_NULL, LogicalType::BOOLEAN);
		is_null->children.push_back(expr.Copy());
		auto check = std::move(is_null);
		auto result_if_true = make_uniq<BoundConstantExpression>(Value::Numeric(expr.return_type, 0));
		auto result_if_false = std::move(*expr_ptr);
		return make_uniq<BoundCaseExpression>(std::move(check), std::move(result_if_true), std::move(result_if_false));
	}
	return nullptr;
}